

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::Checkbox(char *label,bool *v)

{
  ImVec2 IVar1;
  uint uVar2;
  ImGuiWindow *this;
  ImVec2 p_max;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  ImGuiID id;
  ImU32 IVar6;
  char *text;
  ImGuiCol idx;
  ImVec2 pos;
  float fVar7;
  float fVar8;
  bool hovered;
  bool held;
  ImRect total_bb;
  bool local_9a;
  bool local_99;
  bool *local_98;
  ImVec2 local_90;
  float local_88;
  float fStack_84;
  undefined8 uStack_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  ImVec2 local_58;
  ImRect local_48;
  ImVec2 local_38;
  
  pIVar3 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    local_98 = v;
    id = ImGuiWindow::GetID(this,label,(char *)0x0);
    local_58 = CalcTextSize(label,(char *)0x0,true,-1.0);
    local_68 = GetFrameHeight();
    IVar1 = (this->DC).CursorPos;
    local_88 = IVar1.x;
    fStack_84 = IVar1.y;
    fVar7 = 0.0;
    if (0.0 < local_58.x) {
      fVar7 = (pIVar3->Style).ItemInnerSpacing.x + local_58.x;
    }
    fVar8 = (pIVar3->Style).FramePadding.y;
    uStack_80 = 0;
    local_48.Max.x = fVar7 + local_68 + local_88;
    local_48.Min = IVar1;
    local_48.Max.y = fVar8 + fVar8 + local_58.y + fStack_84;
    ItemSize(&local_48,fVar8);
    bVar5 = false;
    bVar4 = ItemAdd(&local_48,id,(ImRect *)0x0,0);
    if (bVar4) {
      bVar5 = ButtonBehavior(&local_48,id,&local_9a,&local_99,0);
      if (bVar5) {
        *local_98 = (bool)(*local_98 ^ 1);
        MarkItemEdited(id);
      }
      fVar7 = local_88;
      local_78 = local_68 + local_88;
      fStack_74 = local_68 + fStack_84;
      fStack_70 = local_68 + (float)uStack_80;
      fStack_6c = local_68 + (float)((ulong)uStack_80 >> 0x20);
      uStack_80 = 0;
      RenderNavHighlight(&local_48,id,1);
      if ((local_99 != true) || (idx = 9, local_9a == false)) {
        idx = local_9a + 7;
      }
      IVar6 = GetColorU32(idx,1.0);
      IVar1.y = fStack_84;
      IVar1.x = local_88;
      p_max.y = fStack_74;
      p_max.x = local_78;
      RenderFrame(IVar1,p_max,IVar6,true,(pIVar3->Style).FrameRounding);
      IVar6 = GetColorU32(0x12,1.0);
      uVar2 = (pIVar3->LastItemData).InFlags;
      if ((uVar2 & 0x40) == 0) {
        if (*local_98 == true) {
          fVar8 = 1.0;
          if (1.0 <= (float)(int)(local_68 / 6.0)) {
            fVar8 = (float)(int)(local_68 / 6.0);
          }
          pos.x = fVar7 + fVar8;
          pos.y = fStack_84 + fVar8;
          RenderCheckMark(this->DrawList,pos,IVar6,local_68 - (fVar8 + fVar8));
        }
      }
      else {
        fVar8 = 1.0;
        if (1.0 <= (float)(int)(local_68 / 3.6)) {
          fVar8 = (float)(int)(local_68 / 3.6);
        }
        local_90.y = fStack_84 + fVar8;
        local_90.x = fVar7 + fVar8;
        local_38.x = local_78 - fVar8;
        local_38.y = fStack_74 - fVar8;
        ImDrawList::AddRectFilled
                  (this->DrawList,&local_90,&local_38,IVar6,(pIVar3->Style).FrameRounding,0);
      }
      local_90.y = (pIVar3->Style).FramePadding.y + fStack_84;
      local_90.x = (pIVar3->Style).ItemInnerSpacing.x + local_78;
      if (pIVar3->LogEnabled == true) {
        if ((uVar2 & 0x40) == 0) {
          text = "[ ]";
          if (*local_98 != false) {
            text = "[x]";
          }
        }
        else {
          text = "[~]";
        }
        LogRenderedText(&local_90,text,(char *)0x0);
      }
      if (0.0 < local_58.x) {
        RenderText(local_90,label,(char *)0x0,true);
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}